

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormatLite::WriteSInt64ToArray
                    (int field_number,int64_t value,uint8_t *target)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = field_number << 3;
  uVar6 = uVar5;
  if (0x7f < uVar5) {
    do {
      *target = (byte)uVar6 | 0x80;
      uVar5 = uVar6 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar5;
    } while (bVar1);
  }
  *target = (byte)uVar5;
  pbVar2 = target + 1;
  uVar3 = value >> 0x3f ^ value * 2;
  uVar4 = uVar3;
  if (0x7f < uVar3) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  return pbVar2 + 1;
}

Assistant:

inline uint8_t* WireFormatLite::WriteSInt64ToArray(int field_number,
                                                   int64_t value,
                                                   uint8_t* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteSInt64NoTagToArray(value, target);
}